

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rlib::string::format<char,unsigned_long_const&,std::__cxx11::string&,std::__cxx11::string_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string *this,char *lpszFormat,unsigned_long *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> format;
  allocator<char> local_131;
  string_type local_130;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_110,(char *)0x0);
  local_110.exceptions_ = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,(char *)this,&local_131);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::parse
            (&local_110,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  inner::f<char,unsigned_long_const,std::__cxx11::string&,std::__cxx11::string_const&>
            (&local_110,(unsigned_long *)lpszFormat,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,args_1);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (__return_storage_ptr__,&local_110);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
            (&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> format(const CharT* lpszFormat, Args&&... args) {
			boost::basic_format<CharT> format;
			format.exceptions(boost::io::no_error_bits);	// 例外を発生させない
			format.parse(lpszFormat);
			try {
				inner::f<CharT>(format, args...);
			} catch (...) {
			}
			return format.str();
		}